

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddCircleFilled(ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments)

{
  uint uVar1;
  uint uVar2;
  int points_count;
  
  if (0.0 < radius && 0xffffff < col) {
    if (num_segments < 1) {
      _PathArcToFastEx(this,center,radius,0,0x30,0);
      points_count = (this->_Path).Size + -1;
      (this->_Path).Size = points_count;
    }
    else {
      uVar1 = 0x200;
      if ((uint)num_segments < 0x200) {
        uVar1 = num_segments;
      }
      uVar2 = 3;
      if (3 < uVar1) {
        uVar2 = uVar1;
      }
      PathArcTo(this,center,radius,0.0,((float)(int)(uVar2 - 1) * 6.2831855) / (float)(int)uVar2,
                uVar2 - 1);
      points_count = (this->_Path).Size;
    }
    AddConvexPolyFilled(this,(this->_Path).Data,points_count,col);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddCircleFilled(const ImVec2& center, float radius, ImU32 col, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0 || radius <= 0.0f)
        return;

    if (num_segments <= 0)
    {
        // Use arc with automatic segment count
        _PathArcToFastEx(center, radius, 0, IM_DRAWLIST_ARCFAST_SAMPLE_MAX, 0);
        _Path.Size--;
    }
    else
    {
        // Explicit segment count (still clamp to avoid drawing insanely tessellated shapes)
        num_segments = ImClamp(num_segments, 3, IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_MAX);

        // Because we are filling a closed shape we remove 1 from the count of segments/points
        const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
        PathArcTo(center, radius, 0.0f, a_max, num_segments - 1);
    }

    PathFillConvex(col);
}